

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

unique_pointer<const_void> __thiscall
pstore::database::getu(database *this,address addr,size_t size,bool initialized)

{
  bool bVar1;
  uint8_t *__p;
  undefined7 in_register_00000009;
  void *extraout_RDX;
  byte in_R8B;
  unique_pointer<const_void> uVar3;
  _func_void_void_ptr *local_50;
  database *local_48;
  database *local_40;
  size_t local_38;
  byte local_29;
  size_t sStack_28;
  bool initialized_local;
  size_t size_local;
  database *this_local;
  address addr_local;
  _Head_base<0UL,_const_void_*,_false> _Var2;
  
  sStack_28 = CONCAT71(in_register_00000009,initialized);
  local_29 = in_R8B & 1;
  local_38 = size;
  size_local = addr.a_;
  this_local = (database *)size;
  addr_local.a_ = (value_type)this;
  check_get_params((database *)addr.a_,(address)size,sStack_28,false);
  bVar1 = storage::request_spans_regions((storage *)(addr.a_ + 8),(address *)&this_local,sStack_28);
  if (bVar1) {
    local_40 = this_local;
    uVar3 = get_spanningu(this,addr,(size_t)this_local,SUB81(sStack_28,0));
    _Var2._M_head_impl =
         uVar3._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
         super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
         super__Head_base<0UL,_const_void_*,_false>._M_head_impl;
  }
  else {
    local_48 = this_local;
    __p = storage::address_to_raw_pointer((storage *)(addr.a_ + 8),(address)this_local);
    local_50 = deleter_nop<void_const>;
    std::unique_ptr<void_const,void(*)(void_const*)>::unique_ptr<void(*)(void_const*),void>
              ((unique_ptr<void_const,void(*)(void_const*)> *)this,__p,&local_50);
    _Var2._M_head_impl = extraout_RDX;
  }
  uVar3._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
  super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
  super__Head_base<0UL,_const_void_*,_false>._M_head_impl = _Var2._M_head_impl;
  uVar3._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
  super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
  super__Tuple_impl<1UL,_void_(*)(const_void_*)>.
  super__Head_base<1UL,_void_(*)(const_void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(const_void_*),_false>)
       (_Head_base<1UL,_void_(*)(const_void_*),_false>)this;
  return (unique_pointer<const_void>)
         uVar3._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
         super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>;
}

Assistant:

auto database::getu (address addr, std::size_t size, bool initialized) const
        -> unique_pointer<void const> {
        this->check_get_params (addr, size, false);
        if (storage_.request_spans_regions (addr, size)) {
            return this->get_spanningu (addr, size, initialized);
        }
        return {storage_.address_to_raw_pointer (addr), deleter_nop<void const>};
    }